

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

void WI_drawDeathmatchStats(void)

{
  ulong uVar1;
  FFont *pFVar2;
  DFrameBuffer *pDVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  EColorRange EVar8;
  FTexture *pFVar9;
  BYTE *string;
  BYTE *pBVar10;
  undefined4 extraout_var;
  char *pcVar11;
  player_t *ppVar12;
  DBot *pDVar13;
  ulong uVar14;
  uint x;
  int iVar15;
  code *__compar;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int local_f0;
  FString leveltime;
  float b;
  float g;
  float r;
  float v;
  float s;
  float h;
  int maxnamewidth;
  BYTE *local_b0;
  undefined8 local_a8;
  FTexture *local_a0;
  ulong local_98;
  int maxiconheight;
  int maxscorewidth;
  char timer [9];
  player_t *sortedplayers [8];
  
  (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
  pFVar9 = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
  WI_drawBackground();
  iVar4 = WI_drawLF();
  HU_GetPlayerWidths(&maxnamewidth,&maxscorewidth,&maxiconheight);
  iVar5 = FTexture::GetScaledHeight(pFVar9);
  local_a0 = pFVar9;
  iVar6 = FTexture::GetScaledTopOffset(pFVar9);
  iVar19 = iVar5 - iVar6;
  if (iVar5 - iVar6 <= maxiconheight) {
    iVar19 = maxiconheight;
  }
  uVar7 = SmallFont->FontHeight * CleanYfac;
  uVar17 = iVar19 * CleanYfac;
  if (iVar19 * CleanYfac < (int)uVar7) {
    uVar17 = uVar7;
  }
  iVar4 = iVar4 + CleanYfac;
  maxiconheight = iVar19;
  string = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_DEATHS");
  pBVar10 = (BYTE *)FStringTable::operator()(&GStrings,"SCORE_FRAGS");
  iVar19 = CleanXfac;
  iVar21 = (maxscorewidth + 8) * CleanXfac;
  local_b0 = pBVar10;
  iVar6 = FFont::StringWidth(SmallFont,"XXXXX");
  iVar5 = FFont::StringWidth(SmallFont,pBVar10);
  if (iVar5 < iVar6) {
    iVar5 = iVar6;
  }
  iVar20 = (maxnamewidth + iVar5 + 8) * CleanXfac + iVar21;
  iVar5 = FFont::StringWidth(SmallFont,string);
  pDVar3 = screen;
  pFVar2 = SmallFont;
  local_a8 = CONCAT44(extraout_var,iVar5);
  uVar16 = (iVar5 + 8) * CleanXfac + iVar20;
  local_98 = (ulong)uVar16;
  x = (int)((screen->super_DSimpleCanvas).super_DCanvas.Width - uVar16) >> 1;
  iVar21 = iVar21 + x;
  iVar20 = iVar20 + x;
  iVar6 = x + uVar16;
  iVar22 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + 3;
  pcVar11 = FStringTable::operator()(&GStrings,"SCORE_NAME");
  DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iVar22,iVar21,iVar4,pcVar11,0x40001393,1,0);
  pBVar10 = local_b0;
  pDVar3 = screen;
  pFVar2 = SmallFont;
  iVar5 = FFont::StringWidth(SmallFont,local_b0);
  DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iVar22,iVar20 - iVar5 * CleanXfac,iVar4,(char *)pBVar10
                    ,0x40001393,1,0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar22,iVar6 - (int)local_a8 * CleanXfac,iVar4,
                    (char *)string,0x40001393,1,0);
  ppVar12 = (player_t *)&players;
  for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
    sortedplayers[lVar18] = ppVar12;
    ppVar12 = ppVar12 + 1;
  }
  local_f0 = (int)((uVar17 - uVar7) + 1) / 2;
  if (teamplay.Value == false) {
    __compar = comparepoints;
  }
  else {
    __compar = compareteams;
  }
  iVar4 = iVar4 + uVar7 + CleanYfac * 6;
  qsort(sortedplayers,8,8,__compar);
  lVar18 = 0;
  do {
    pDVar3 = screen;
    pFVar2 = SmallFont;
    if (lVar18 == 8) {
      iVar19 = iVar4 + uVar7 + CleanYfac * 3;
      EVar8 = (uint)(((undefined1)gameinfo.gametype & GAME_Raven) == GAME_Any) * 8 + CR_GREEN;
      pcVar11 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
      DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,EVar8,iVar21,iVar19,pcVar11,0x40001393,1,0);
      WI_drawNum(SmallFont,iVar20,iVar19,total_frags,0,false,EVar8);
      if (3 < ng_state) {
        WI_drawNum(SmallFont,iVar6,iVar19,total_deaths,0,false,EVar8);
      }
      iVar4 = iVar19 + uVar7 + CleanYfac;
      iVar19 = plrs[me].stime;
      pcVar11 = FStringTable::operator()(&GStrings,"SCORE_LVLTIME");
      FString::FString(&leveltime,pcVar11);
      FString::operator+=(&leveltime,": ");
      uVar14 = ((long)iVar19 * 0x62) / 0xdac;
      uVar17 = (int)uVar14 >> 0x1f;
      uVar1 = (ulong)uVar17 << 0x20 | uVar14 & 0xffffffff;
      mysnprintf(timer,9,"%02i:%02i:%02i",(long)uVar1 / 0xe10 & 0xffffffff,
                 (ulong)(uint)(int)(short)((short)((long)uVar1 % 0xe10) / 0x3c),
                 (long)((ulong)uVar17 << 0x20 | uVar14 & 0xffffffff) % 0x3c & 0xffffffff);
      FString::operator+=(&leveltime,timer);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,EVar8,x,iVar4,leveltime.Chars,0x40001393,1,0);
      FString::~FString(&leveltime);
      return;
    }
    ppVar12 = sortedplayers[lVar18];
    iVar5 = (int)((long)&ppVar12[-0x916e].morphTics / 0x2a0);
    if (playeringame[iVar5] == true) {
      D_GetPlayerColor(iVar5,&h,&s,&v,(FPlayerColorSet **)0x0);
      HSVtoRGB(&r,&g,&b,h,s,v);
      iVar22 = (int)(r * 255.0);
      if (0xfe < iVar22) {
        iVar22 = 0xff;
      }
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      iVar15 = (int)(g * 255.0);
      if (0xfe < iVar15) {
        iVar15 = 0xff;
      }
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      uVar16 = (uint)(b * 255.0);
      if (0xfe < (int)uVar16) {
        uVar16 = 0xff;
      }
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f4ccccd,screen,(ulong)(uVar16 | iVar15 << 8 | iVar22 << 0x10),(ulong)x,
                 (ulong)(uint)(iVar4 - local_f0),(ulong)(uint)((int)local_98 + CleanXfac * 8),
                 (ulong)uVar17);
      if (playerready[iVar5] == false) {
        pDVar13 = GC::ReadBarrier<DBot>((DBot **)&ppVar12->Bot);
        if (pDVar13 != (DBot *)0x0) goto LAB_00493b6e;
      }
      else {
LAB_00493b6e:
        DCanvas::DrawTexture
                  ((DCanvas *)screen,local_a0,(double)(int)(x - (uint)local_a0->Width * CleanXfac),
                   (double)iVar4,0x40001393,1,0);
      }
      EVar8 = HU_GetRowColor(ppVar12,consoleplayer == iVar5);
      uVar16 = (ppVar12->mo->ScoreIcon).texnum;
      if (0 < (long)(int)uVar16) {
        if (uVar16 < TexMan.Textures.Count) {
          pFVar9 = TexMan.Textures.Array[(int)uVar16].Texture;
        }
        else {
          pFVar9 = (FTexture *)0x0;
        }
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar9,(double)(int)(x + iVar19 * 8),(double)iVar4,0x40001393,1
                   ,0);
      }
      pDVar3 = screen;
      pFVar2 = SmallFont;
      iVar22 = iVar4 + local_f0;
      pcVar11 = userinfo_t::GetName(&ppVar12->userinfo);
      DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,EVar8,iVar21,iVar22,pcVar11,0x40001393,1,0);
      WI_drawNum(SmallFont,iVar20,iVar22,cnt_frags[iVar5],0,false,EVar8);
      if (1 < ng_state) {
        WI_drawNum(SmallFont,iVar6,iVar22,cnt_deaths[iVar5],0,false,EVar8);
      }
      iVar4 = iVar4 + uVar17 + CleanYfac;
    }
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

void WI_drawDeathmatchStats ()
{
	int i, pnum, x, y, ypadding, height, lineheight;
	int maxnamewidth, maxscorewidth, maxiconheight;
	int pwidth = IntermissionFont->GetCharWidth('%');
	int icon_x, name_x, frags_x, deaths_x;
	int deaths_len;
	float h, s, v, r, g, b;
	EColorRange color;
	const char *text_deaths, *text_frags;
	FTexture *readyico = TexMan.FindTexture("READYICO");
	player_t *sortedplayers[MAXPLAYERS];

	// draw animated background
	WI_drawBackground();

	y = WI_drawLF();

	HU_GetPlayerWidths(maxnamewidth, maxscorewidth, maxiconheight);
	// Use the readyico height if it's bigger.
	height = readyico->GetScaledHeight() - readyico->GetScaledTopOffset();
	maxiconheight = MAX(height, maxiconheight);
	height = SmallFont->GetHeight() * CleanYfac;
	lineheight = MAX(height, maxiconheight * CleanYfac);
	ypadding = (lineheight - height + 1) / 2;
	y += CleanYfac;

	text_deaths = GStrings("SCORE_DEATHS");
	//text_color = GStrings("SCORE_COLOR");
	text_frags = GStrings("SCORE_FRAGS");

	icon_x = 8 * CleanXfac;
	name_x = icon_x + maxscorewidth * CleanXfac;
	frags_x = name_x + (maxnamewidth + MAX(SmallFont->StringWidth("XXXXX"), SmallFont->StringWidth(text_frags)) + 8) * CleanXfac;
	deaths_x = frags_x + ((deaths_len = SmallFont->StringWidth(text_deaths)) + 8) * CleanXfac;

	x = (SCREENWIDTH - deaths_x) >> 1;
	icon_x += x;
	name_x += x;
	frags_x += x;
	deaths_x += x;

	color = (gameinfo.gametype & GAME_Raven) ? CR_GREEN : CR_UNTRANSLATED;

	screen->DrawText(SmallFont, color, name_x, y, GStrings("SCORE_NAME"), DTA_CleanNoMove, true, TAG_DONE);
	screen->DrawText(SmallFont, color, frags_x - SmallFont->StringWidth(text_frags)*CleanXfac, y, text_frags, DTA_CleanNoMove, true, TAG_DONE);
	screen->DrawText(SmallFont, color, deaths_x - deaths_len*CleanXfac, y, text_deaths, DTA_CleanNoMove, true, TAG_DONE);
	y += height + 6 * CleanYfac;

	// Sort all players
	for (i = 0; i < MAXPLAYERS; i++)
	{
		sortedplayers[i] = &players[i];
	}

	if (teamplay)
		qsort(sortedplayers, MAXPLAYERS, sizeof(player_t *), compareteams);
	else
		qsort(sortedplayers, MAXPLAYERS, sizeof(player_t *), comparepoints);

	// Draw lines for each player
	for (i = 0; i < MAXPLAYERS; i++)
	{
		player_t *player = sortedplayers[i];
		pnum = int(player - players);

		if (!playeringame[pnum])
			continue;

		D_GetPlayerColor(pnum, &h, &s, &v, NULL);
		HSVtoRGB(&r, &g, &b, h, s, v);

		screen->Dim(MAKERGB(clamp(int(r*255.f), 0, 255), 
			clamp(int(g*255.f), 0, 255), 
			clamp(int(b*255.f), 0, 255)), 0.8f, x, y - ypadding, (deaths_x - x) + (8 * CleanXfac), lineheight);

		if (playerready[pnum] || player->Bot != NULL) // Bots are automatically assumed ready, to prevent confusion
			screen->DrawTexture(readyico, x - (readyico->GetWidth() * CleanXfac), y, DTA_CleanNoMove, true, TAG_DONE);

		color = (EColorRange)HU_GetRowColor(player, pnum == consoleplayer);
		if (player->mo->ScoreIcon.isValid())
		{
			FTexture *pic = TexMan[player->mo->ScoreIcon];
			screen->DrawTexture(pic, icon_x, y, DTA_CleanNoMove, true, TAG_DONE);
		}
		screen->DrawText(SmallFont, color, name_x, y + ypadding, player->userinfo.GetName(), DTA_CleanNoMove, true, TAG_DONE);
		WI_drawNum(SmallFont, frags_x, y + ypadding, cnt_frags[pnum], 0, false, color);
		if (ng_state >= 2)
		{
			WI_drawNum(SmallFont, deaths_x, y + ypadding, cnt_deaths[pnum], 0, false, color);
		}
		y += lineheight + CleanYfac;
	}

	// Draw "TOTAL" line
	y += height + 3 * CleanYfac;
	color = (gameinfo.gametype & GAME_Raven) ? CR_GREEN : CR_UNTRANSLATED;
	screen->DrawText(SmallFont, color, name_x, y, GStrings("SCORE_TOTAL"), DTA_CleanNoMove, true, TAG_DONE);
	WI_drawNum(SmallFont, frags_x, y, total_frags, 0, false, color);
	if (ng_state >= 4)
	{
		WI_drawNum(SmallFont, deaths_x, y, total_deaths, 0, false, color);
	}

	// Draw game time
	y += height + CleanYfac;

	int seconds = Tics2Seconds(plrs[me].stime);
	int hours = seconds / 3600;
	int minutes = (seconds % 3600) / 60;
	seconds = seconds % 60;

	FString leveltime = GStrings("SCORE_LVLTIME");
	leveltime += ": ";

	char timer[sizeof "HH:MM:SS"];
	mysnprintf(timer, sizeof(timer), "%02i:%02i:%02i", hours, minutes, seconds);
	leveltime += timer;

	screen->DrawText(SmallFont, color, x, y, leveltime, DTA_CleanNoMove, true, TAG_DONE);
}